

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5e07f8::AVxFirstPassEncoderThreadTest::AVxFirstPassEncoderThreadTest
          (AVxFirstPassEncoderThreadTest *this)

{
  ParamType *pPVar1;
  
  libaom_test::CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>::CodecTestWith4Params
            (&this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>);
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
           ::GetParam();
  (this->super_EncoderTest).codec_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  (this->super_EncoderTest).abort_ = false;
  (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p =
       (pointer)&(this->super_EncoderTest).stats_.buffer_.field_2;
  (this->super_EncoderTest).stats_.buffer_._M_string_length = 0;
  (this->super_EncoderTest).stats_.buffer_.field_2._M_local_buf[0] = '\0';
  (this->super_EncoderTest).init_flags_ = 0;
  (this->super_EncoderTest).frame_flags_ = 0;
  (this->super_EncoderTest).mode_ = kRealTime;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  (this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__AVxFirstPassEncoderThreadTest_00ef7e10;
  (this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AVxFirstPassEncoderThreadTest_00ef7e78;
  (this->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__AVxFirstPassEncoderThreadTest_00ef7e98;
  (this->super_EncoderTest).field_0x3dc = 0;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
           ::GetParam();
  this->encoding_mode_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int,_int>.
       super__Head_base<1UL,_libaom_test::TestMode,_false>._M_head_impl;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
           ::GetParam();
  this->set_cpu_used_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
           ::GetParam();
  this->tile_rows_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int>.super__Tuple_impl<3UL,_int,_int>.
       super__Head_base<3UL,_int,_false>._M_head_impl;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
           ::GetParam();
  this->tile_cols_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_int,_int>.
       super__Tuple_impl<2UL,_int,_int,_int>.super__Tuple_impl<3UL,_int,_int>.
       super__Tuple_impl<4UL,_int>.super__Head_base<4UL,_int,_false>._M_head_impl;
  (this->super_EncoderTest).init_flags_ = 0x10000;
  this->row_mt_ = 1;
  (this->firstpass_stats_).buf = (void *)0x0;
  (this->firstpass_stats_).sz = 0;
  return;
}

Assistant:

AVxFirstPassEncoderThreadTest()
      : EncoderTest(GET_PARAM(0)), encoder_initialized_(false),
        encoding_mode_(GET_PARAM(1)), set_cpu_used_(GET_PARAM(2)),
        tile_rows_(GET_PARAM(3)), tile_cols_(GET_PARAM(4)) {
    init_flags_ = AOM_CODEC_USE_PSNR;

    row_mt_ = 1;
    firstpass_stats_.buf = nullptr;
    firstpass_stats_.sz = 0;
  }